

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffDeclGroup(NodeDiffComputer *this,DeclGroup *lhs,DeclGroup *rhs)

{
  size_type_conflict sVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  ulong uVar6;
  
  sVar1 = (lhs->_decls)._size;
  iVar2 = sVar1 - (rhs->_decls)._size;
  if (iVar2 == 0) {
    if (sVar1 == 0) {
      iVar4 = 0;
    }
    else {
      uVar6 = 0;
      iVar4 = 0;
      do {
        iVar3 = diffVarDecl(this,(lhs->_decls)._vals[uVar6],(rhs->_decls)._vals[uVar6]);
        if (this->limit < iVar3) {
          return iVar3;
        }
        iVar4 = iVar4 + iVar3;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (lhs->_decls)._size);
    }
  }
  else {
    iVar5 = -iVar2;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    iVar4 = iVar5 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return iVar4;
}

Assistant:

int32_t diffDeclGroup(const DeclGroup *lhs, const DeclGroup *rhs) {
    const auto &leftGroup = lhs->declarations();
    const auto &rightGroup = rhs->declarations();

    if (leftGroup.size() != rightGroup.size())
      return sizeDiff(leftGroup.size(), rightGroup.size());

    int32_t result = 0;

    for (int32_t i = 0; i < leftGroup.size(); ++i) {
      const VarDecl *l = leftGroup[i];
      const VarDecl *r = rightGroup[i];

      int32_t tmp = diffVarDecl(l, r);

      if (tmp > limit)
        return tmp;

      result += tmp;
    }

    return result;
  }